

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryPool.cpp
# Opt level: O0

void __thiscall cali::MemoryPool::MemoryPoolImpl::~MemoryPoolImpl(MemoryPoolImpl *this)

{
  bool bVar1;
  reference pCVar2;
  Chunk *c;
  iterator __end1;
  iterator __begin1;
  vector<cali::MemoryPool::MemoryPoolImpl::Chunk,_std::allocator<cali::MemoryPool::MemoryPoolImpl::Chunk>_>
  *__range1;
  MemoryPoolImpl *this_local;
  
  __end1 = std::
           vector<cali::MemoryPool::MemoryPoolImpl::Chunk,_std::allocator<cali::MemoryPool::MemoryPoolImpl::Chunk>_>
           ::begin(&this->m_chunks);
  c = (Chunk *)std::
               vector<cali::MemoryPool::MemoryPoolImpl::Chunk,_std::allocator<cali::MemoryPool::MemoryPoolImpl::Chunk>_>
               ::end(&this->m_chunks);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<cali::MemoryPool::MemoryPoolImpl::Chunk_*,_std::vector<cali::MemoryPool::MemoryPoolImpl::Chunk,_std::allocator<cali::MemoryPool::MemoryPoolImpl::Chunk>_>_>
                                *)&c);
    if (!bVar1) break;
    pCVar2 = __gnu_cxx::
             __normal_iterator<cali::MemoryPool::MemoryPoolImpl::Chunk_*,_std::vector<cali::MemoryPool::MemoryPoolImpl::Chunk,_std::allocator<cali::MemoryPool::MemoryPoolImpl::Chunk>_>_>
             ::operator*(&__end1);
    if (pCVar2->ptr != (uchar *)0x0) {
      operator_delete__(pCVar2->ptr);
    }
    __gnu_cxx::
    __normal_iterator<cali::MemoryPool::MemoryPoolImpl::Chunk_*,_std::vector<cali::MemoryPool::MemoryPoolImpl::Chunk,_std::allocator<cali::MemoryPool::MemoryPoolImpl::Chunk>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<cali::MemoryPool::MemoryPoolImpl::Chunk,_std::allocator<cali::MemoryPool::MemoryPoolImpl::Chunk>_>
  ::clear(&this->m_chunks);
  std::
  vector<cali::MemoryPool::MemoryPoolImpl::Chunk,_std::allocator<cali::MemoryPool::MemoryPoolImpl::Chunk>_>
  ::~vector(&this->m_chunks);
  ConfigSet::~ConfigSet(&this->m_config);
  return;
}

Assistant:

~MemoryPoolImpl()
    {
        for (auto& c : m_chunks)
            delete[] c.ptr;

        m_chunks.clear();
    }